

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::maybeLabelidx<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,bool inDelegate)

{
  bool bVar1;
  uint *puVar2;
  Name *pNVar3;
  Ok local_41;
  undefined1 local_40 [8];
  optional<wasm::Name> id;
  optional<unsigned_int> x;
  bool inDelegate_local;
  ParseModuleTypesCtx *ctx_local;
  
  register0x00000000 = (_Optional_payload_base<unsigned_int>)Lexer::takeU32(&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>.field_0x14);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::operator*
                       ((optional<unsigned_int> *)
                        &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>.field_0x14);
    NullInstrParserCtx::getLabelFromIdx((NullInstrParserCtx *)ctx,*puVar2,inDelegate);
    MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>
              (__return_storage_ptr__,
               (Ok *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Name>.field_0x13);
  }
  else {
    Lexer::takeID((optional<wasm::Name> *)local_40,&ctx->in);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
    if (bVar1) {
      pNVar3 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_40);
      NullInstrParserCtx::getLabelFromName
                ((NullInstrParserCtx *)ctx,(Name)(pNVar3->super_IString).str,inDelegate);
      MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_41);
    }
    else {
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LabelIdxT> maybeLabelidx(Ctx& ctx, bool inDelegate) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getLabelFromIdx(*x, inDelegate);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getLabelFromName(*id, inDelegate);
  }
  return {};
}